

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O2

void __thiscall Parameterization::PrintPlot3DHeader(Parameterization *this,ofstream *outfile)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)outfile,this->Gmax);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = 0;
  while (this->G = iVar1, iVar1 < this->Gmax) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)outfile,this->Jmax);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Kmax);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Lmax);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = this->G + 1;
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3DHeader(ofstream& outfile) {
  outfile << Gmax << endl;
  for (G = 0; G < Gmax; G++) {
    outfile << Jmax << " " << Kmax << " " << Lmax << endl;
  }
}